

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.h
# Opt level: O0

void __thiscall
cmQtAutoGeneratorMocUic::BaseSettingsT::BaseSettingsT(BaseSettingsT *this,FileSystem *fileSystem)

{
  FileSystem *fileSystem_local;
  BaseSettingsT *this_local;
  
  this->MultiConfig = false;
  this->IncludeProjectDirsBefore = false;
  this->QtVersionMajor = 4;
  this->NumThreads = 1;
  std::__cxx11::string::string((string *)&this->ProjectSourceDir);
  std::__cxx11::string::string((string *)&this->ProjectBinaryDir);
  std::__cxx11::string::string((string *)&this->CurrentSourceDir);
  std::__cxx11::string::string((string *)&this->CurrentBinaryDir);
  std::__cxx11::string::string((string *)&this->AutogenBuildDir);
  std::__cxx11::string::string((string *)&this->AutogenIncludeDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HeaderExtensions);
  this->FileSys = fileSystem;
  return;
}

Assistant:

BaseSettingsT(FileSystem* fileSystem)
      : MultiConfig(false)
      , IncludeProjectDirsBefore(false)
      , QtVersionMajor(4)
      , NumThreads(1)
      , FileSys(fileSystem)
    {
    }